

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autogenerated_settings.cpp
# Opt level: O2

void duckdb::LateMaterializationMaxRowsSetting::ResetLocal(ClientContext *context)

{
  ClientConfig *pCVar1;
  ClientConfig CStack_1f8;
  
  switchD_016d4fed::default(&CStack_1f8,0,0x1e8);
  ClientConfig::ClientConfig(&CStack_1f8);
  pCVar1 = ClientConfig::GetConfig(context);
  pCVar1->late_materialization_max_rows = CStack_1f8.late_materialization_max_rows;
  ClientConfig::~ClientConfig(&CStack_1f8);
  return;
}

Assistant:

void LateMaterializationMaxRowsSetting::ResetLocal(ClientContext &context) {
	ClientConfig::GetConfig(context).late_materialization_max_rows = ClientConfig().late_materialization_max_rows;
}